

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_file_dictionary_handler.c
# Opt level: O2

ion_err_t ffdict_create_dictionary
                    (ion_dictionary_id_t id,ion_key_type_t key_type,ion_key_size_t key_size,
                    ion_value_size_t value_size,ion_dictionary_size_t dictionary_size,
                    ion_dictionary_compare_t compare,ion_dictionary_handler_t *handler,
                    ion_dictionary_t *dictionary)

{
  ion_err_t iVar1;
  ion_flat_file_t *flat_file;
  
  flat_file = (ion_flat_file_t *)malloc(0x68);
  dictionary->instance = (ion_dictionary_parent_t *)flat_file;
  if (flat_file == (ion_flat_file_t *)0x0) {
    iVar1 = '\x06';
  }
  else {
    (flat_file->super).compare = compare;
    (flat_file->super).type = dictionary_type_flat_file_t;
    iVar1 = flat_file_initialize(flat_file,id,key_type,key_size,value_size,dictionary_size);
    if (handler != (ion_dictionary_handler_t *)0x0 && iVar1 == '\0') {
      dictionary->handler = handler;
      iVar1 = '\0';
    }
  }
  return iVar1;
}

Assistant:

ion_err_t
ffdict_create_dictionary(
	ion_dictionary_id_t			id,
	ion_key_type_t				key_type,
	ion_key_size_t				key_size,
	ion_value_size_t			value_size,
	ion_dictionary_size_t		dictionary_size,
	ion_dictionary_compare_t	compare,
	ion_dictionary_handler_t	*handler,
	ion_dictionary_t			*dictionary
) {
	dictionary->instance = malloc(sizeof(ion_flat_file_t));

	if (NULL == dictionary->instance) {
		return err_out_of_memory;
	}

	dictionary->instance->compare	= compare;
	dictionary->instance->type		= dictionary_type_flat_file_t;

	ion_err_t result = flat_file_initialize((ion_flat_file_t *) dictionary->instance, id, key_type, key_size, value_size, dictionary_size);

	if ((err_ok == result) && (NULL != handler)) {
		dictionary->handler = handler;
	}

	return result;
}